

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceAmbient::~IfcLightSourceAmbient(IfcLightSourceAmbient *this)

{
  long *plVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  plVar1 = (long *)(&(this->super_IfcLightSource).field_0x40 + (long)p_Var2);
  plVar1[-8] = 0x8813a8;
  plVar1[10] = 0x881420;
  plVar1[-6] = 0x8813d0;
  plVar1[-4] = 0x8813f8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2),0xa8);
  return;
}

Assistant:

IfcLightSourceAmbient() : Object("IfcLightSourceAmbient") {}